

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateCopyInitFields
          (MessageGenerator *this,Printer *p)

{
  long *plVar1;
  Printer *pPVar2;
  bool bVar3;
  long lVar4;
  FieldDescriptor *first;
  const_iterator end;
  const_iterator begin;
  anon_class_16_2_a9d32e29 emit_pending_copy_fields;
  int has_bit_word_index;
  anon_class_32_4_40eba909 emit_copy_message;
  anon_class_16_2_fd512ddd has_message;
  anon_class_24_3_e47482a1 load_has_bits;
  anon_class_1_0_00000001 local_281;
  long *local_280 [2];
  long local_270 [2];
  undefined1 local_260 [40];
  undefined8 local_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  long alStack_228 [2];
  pointer local_218;
  undefined1 local_210 [8];
  Printer *local_208;
  long *local_200;
  Printer **local_1f8;
  undefined4 local_1ec;
  MessageGenerator **local_1e8;
  Printer **local_1e0;
  MessageGenerator **local_1d8;
  MessageGenerator *local_1d0;
  long *local_1c8;
  undefined8 local_1c0;
  long local_1b8;
  long lStack_1b0;
  undefined1 local_1a8 [24];
  code *local_190;
  byte local_188;
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  undefined1 local_160;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_158;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  code *local_e0;
  code *local_d8;
  undefined1 local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8;
  undefined1 local_60;
  MessageGenerator *local_58;
  Printer **local_50;
  MessageGenerator *local_48;
  undefined4 *local_40;
  Printer **local_38;
  
  local_210 = (undefined1  [8])
              (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_218 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_200 = alStack_228 + 1;
  alStack_228[1] = 0;
  local_40 = &local_1ec;
  local_1ec = 0xffffffff;
  local_1e8 = &local_48;
  local_1d8 = &local_58;
  local_208 = p;
  local_1f8 = &local_208;
  local_1e0 = &local_208;
  local_1d0 = this;
  local_58 = this;
  local_50 = &local_208;
  local_48 = this;
  local_38 = &local_208;
  if (0 < this->descriptor_->extension_range_count_) {
    io::Printer::Emit(p,0,0,0x4a,
                      "\n      _impl_._extensions_.MergeFrom(this, from._impl_._extensions_);\n    "
                     );
  }
  pPVar2 = local_208;
  plVar1 = (long *)(local_260 + 0x10);
  local_260._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"copy_fields","");
  local_1c8 = &local_1b8;
  if ((long *)local_260._0_8_ == plVar1) {
    lStack_1b0 = local_260._24_8_;
  }
  else {
    local_1c8 = (long *)local_260._0_8_;
  }
  local_1c0 = local_260._8_8_;
  local_260._8_8_ = 0;
  local_260[0x10] = 0;
  local_260._0_8_ = plVar1;
  local_1a8._0_8_ = operator_new(0x40);
  *(undefined1 **)local_1a8._0_8_ = local_210;
  *(pointer **)(local_1a8._0_8_ + 8) = &local_218;
  *(MessageGenerator **)(local_1a8._0_8_ + 0x10) = this;
  *(Printer ***)(local_1a8._0_8_ + 0x18) = &local_208;
  *(long ***)(local_1a8._0_8_ + 0x20) = &local_200;
  *(MessageGenerator ****)(local_1a8._0_8_ + 0x28) = &local_1e8;
  *(long **)(local_1a8._0_8_ + 0x30) = alStack_228 + 1;
  *(undefined1 *)(local_1a8._0_8_ + 0x38) = 0;
  local_190 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_1a8._8_8_ = 0;
  local_1a8._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_188 = '\x01';
  local_180 = &local_170;
  local_178 = 0;
  local_170 = 0;
  local_160 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_180,0,(char *)0x0,0x522f0c);
  local_158._M_engaged = false;
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"copy_oneof_fields","");
  local_110 = &local_100;
  if (local_280[0] == local_270) {
    uStack_f8 = local_270[1];
  }
  else {
    local_110 = local_280[0];
  }
  local_108 = local_280[1];
  local_280[1] = (long *)0x0;
  local_270[0]._0_1_ = 0;
  local_280[0] = local_270;
  local_f0 = (undefined8 *)operator_new(0x18);
  *local_f0 = this;
  local_f0[1] = &local_208;
  *(undefined1 *)(local_f0 + 2) = 0;
  local_d8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_e8 = 0;
  local_e0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_d0 = 1;
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  local_a8 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,0x522f0c);
  local_60 = 0;
  io::Printer::Emit(pPVar2,&local_1c8,2,0x47,
                    "\n            $copy_fields$;\n            $copy_oneof_fields$;\n          ");
  lVar4 = 0x170;
  do {
    if (*(char *)((long)&local_1d0 + lVar4) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_210 + lVar4));
    }
    if ((long *)((long)alStack_228 + lVar4) != *(long **)((long)&local_238 + lVar4)) {
      operator_delete(*(long **)((long)&local_238 + lVar4),*(long *)((long)alStack_228 + lVar4) + 1)
      ;
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_260[lVar4 + 0x20]]._M_data)
              (&local_281,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_260 + lVar4));
    local_260[lVar4 + 0x20] = 0xff;
    if ((long *)((long)local_270 + lVar4) != *(long **)((long)local_280 + lVar4)) {
      operator_delete(*(long **)((long)local_280 + lVar4),*(long *)((long)local_270 + lVar4) + 1);
    }
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != 0);
  if (local_280[0] != local_270) {
    operator_delete(local_280[0],CONCAT71(local_270[0]._1_7_,(undefined1)local_270[0]) + 1);
  }
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_,CONCAT71(local_260._17_7_,local_260[0x10]) + 1);
  }
  bVar3 = ShouldSplit(this->descriptor_,&this->options_);
  pPVar2 = local_208;
  if (bVar3) {
    local_260._32_8_ = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_260 + 0x20),"copy_split_fields","");
    local_1c8 = &local_1b8;
    if ((undefined1 *)local_260._32_8_ == &local_230) {
      lStack_1b0 = alStack_228[0];
    }
    else {
      local_1c8 = (long *)local_260._32_8_;
    }
    local_1b8 = CONCAT71(uStack_22f,local_230);
    local_1c0 = local_238;
    local_238 = 0;
    local_230 = 0;
    local_260._32_8_ = &local_230;
    local_1a8._0_8_ = operator_new(0x38);
    *(undefined1 **)local_1a8._0_8_ = local_210;
    *(pointer **)(local_1a8._0_8_ + 8) = &local_218;
    *(MessageGenerator **)(local_1a8._0_8_ + 0x10) = this;
    *(Printer ***)(local_1a8._0_8_ + 0x18) = &local_208;
    *(long ***)(local_1a8._0_8_ + 0x20) = &local_200;
    *(long **)(local_1a8._0_8_ + 0x28) = alStack_228 + 1;
    *(undefined1 *)(local_1a8._0_8_ + 0x30) = 0;
    local_190 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_1a8._8_8_ = 0;
    local_1a8._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_188 = 1;
    local_178 = 0;
    local_170 = 0;
    local_160 = 0;
    local_180 = &local_170;
    std::__cxx11::string::_M_replace((ulong)&local_180,0,(char *)0x0,0x522f0c);
    local_158._M_engaged = false;
    io::Printer::Emit(pPVar2,&local_1c8,1,0xb8,
                      "\n              if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n                PrepareSplitMessageForWrite();\n                $copy_split_fields$;\n              }\n            "
                     );
    if (local_158._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_158);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_188]._M_data)
              (&local_281,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)local_1a8);
    local_188 = 0xff;
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if ((undefined1 *)local_260._32_8_ != &local_230) {
      operator_delete((void *)local_260._32_8_,CONCAT71(uStack_22f,local_230) + 1);
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateCopyInitFields(io::Printer* p) const {
  auto begin = optimized_order_.begin();
  auto end = optimized_order_.end();
  const FieldDescriptor* first = nullptr;

  auto emit_pending_copy_fields = [&](decltype(end) itend, bool split) {
    if (first != nullptr) {
      const FieldDescriptor* last = itend[-1];
      if (first != last) {
        p->Emit({{"first", FieldName(first)},
                 {"last", FieldName(last)},
                 {"Impl", split ? "Impl_::Split" : "Impl_"},
                 {"pdst", split ? "_impl_._split_" : "&_impl_"},
                 {"psrc", split ? "from._impl_._split_" : "&from._impl_"}},
                R"cc(
                  ::memcpy(reinterpret_cast<char *>($pdst$) +
                               offsetof($Impl$, $first$_),
                           reinterpret_cast<const char *>($psrc$) +
                               offsetof($Impl$, $first$_),
                           offsetof($Impl$, $last$_) -
                               offsetof($Impl$, $first$_) +
                               sizeof($Impl$::$last$_));
                )cc");
      } else {
        p->Emit({{"field", FieldMemberName(first, split)}},
                R"cc(
                  $field$ = from.$field$;
                )cc");
      }
      first = nullptr;
    }
  };

  int has_bit_word_index = -1;
  auto load_has_bits = [&](const FieldDescriptor* field) {
    if (has_bit_indices_.empty()) return;
    int has_bit_index = has_bit_indices_[field->index()];
    if (has_bit_word_index != has_bit_index / 32) {
      p->Emit({{"declare", has_bit_word_index < 0 ? "::uint32_t " : ""},
               {"index", has_bit_index / 32}},
              "$declare$cached_has_bits = _impl_._has_bits_[$index$];\n");
      has_bit_word_index = has_bit_index / 32;
    }
  };

  auto has_message = [&](const FieldDescriptor* field) {
    if (has_bit_indices_.empty()) {
      p->Emit("from.$field$ != nullptr");
    } else {
      int has_bit_index = has_bit_indices_[field->index()];
      p->Emit({{"condition", GenerateConditionMaybeWithProbabilityForField(
                                 has_bit_index, field, options_)}},
              "$condition$");
    }
  };

  auto emit_copy_message = [&](const FieldDescriptor* field) {
    load_has_bits(field);
    p->Emit({{"has_msg", [&] { has_message(field); }},
             {"submsg", FieldMessageTypeName(field, options_)}},
            R"cc(
              $field$ = ($has_msg$)
                            ? $superclass$::CopyConstruct(arena, *from.$field$)
                            : nullptr;
            )cc");
  };

  auto generate_copy_fields = [&] {
    for (auto it = begin; it != end; ++it) {
      const auto& gen = field_generators_.get(*it);
      auto v = p->WithVars(FieldVars(*it, options_));

      // Non trivial field values are copy constructed
      if (!gen.has_trivial_value() || gen.should_split()) {
        emit_pending_copy_fields(it, false);
        continue;
      }

      if (gen.is_message()) {
        emit_pending_copy_fields(it, false);
        emit_copy_message(*it);
      } else if (first == nullptr) {
        first = *it;
      }
    }
    emit_pending_copy_fields(end, false);
  };

  auto generate_copy_split_fields = [&] {
    for (auto it = begin; it != end; ++it) {
      const auto& gen = field_generators_.get(*it);
      auto v = p->WithVars(FieldVars(*it, options_));

      if (!gen.should_split()) {
        emit_pending_copy_fields(it, true);
        continue;
      }

      if (gen.is_trivial()) {
        if (first == nullptr) first = *it;
      } else {
        emit_pending_copy_fields(it, true);
        gen.GenerateCopyConstructorCode(p);
      }
    }
    emit_pending_copy_fields(end, true);
  };

  auto generate_copy_oneof_fields = [&]() {
    for (const auto* oneof : OneOfRange(descriptor_)) {
      p->Emit(
          {{"name", oneof->name()},
           {"NAME", absl::AsciiStrToUpper(oneof->name())},
           {"cases",
            [&] {
              for (const auto* field : FieldRange(oneof)) {
                p->Emit(
                    {{"Name", UnderscoresToCamelCase(field->name(), true)},
                     {"field", FieldMemberName(field, /*split=*/false)},
                     {"body",
                      [&] {
                        field_generators_.get(field).GenerateOneofCopyConstruct(
                            p);
                      }}},
                    R"cc(
                      case k$Name$:
                        $body$;
                        break;
                    )cc");
              }
            }}},
          R"cc(
            switch ($name$_case()) {
              case $NAME$_NOT_SET:
                break;
                $cases$;
            }
          )cc");
    }
  };

  if (descriptor_->extension_range_count() > 0) {
    p->Emit(R"cc(
      _impl_._extensions_.MergeFrom(this, from._impl_._extensions_);
    )cc");
  }

  p->Emit({{"copy_fields", generate_copy_fields},
           {"copy_oneof_fields", generate_copy_oneof_fields}},
          R"cc(
            $copy_fields$;
            $copy_oneof_fields$;
          )cc");

  if (ShouldSplit(descriptor_, options_)) {
    p->Emit({{"copy_split_fields", generate_copy_split_fields}},
            R"cc(
              if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {
                PrepareSplitMessageForWrite();
                $copy_split_fields$;
              }
            )cc");
  }
}